

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_VDR(coda_cdf_product *product_file,int64_t offset,int is_zvar)

{
  int iVar1;
  uint rec_varys;
  uint has_compression_00;
  int local_1f4;
  int i;
  int has_compression;
  int record_varys;
  int32_t dim_varys [8];
  int32_t zdim_sizes [8];
  uint local_19c;
  char local_198 [4];
  int32_t num_dims;
  char name [257];
  undefined1 local_8c [4];
  long lStack_88;
  int32_t blocking_factor;
  int64_t cpr_spr_offset;
  int32_t num;
  int32_t num_elems;
  int32_t srecords;
  int32_t flags;
  int64_t vxr_tail;
  int64_t vxr_head;
  int32_t max_rec;
  int32_t data_type;
  int64_t vdr_next;
  coda_cdf_variable *pcStack_48;
  int32_t record_type;
  coda_cdf_variable *variable;
  coda_dynamic_type *variable_type;
  int64_t iStack_30;
  int is_zvar_local;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  if (offset == 0) {
    product_file_local._4_4_ = 0;
  }
  else {
    variable_type._4_4_ = is_zvar;
    iStack_30 = offset;
    offset_local = (int64_t)product_file;
    iVar1 = read_bytes(product_file->raw_product,offset + 8,4,(void *)((long)&vdr_next + 4));
    if (iVar1 < 0) {
      product_file_local._4_4_ = -1;
    }
    else {
      swap4((void *)((long)&vdr_next + 4));
      if (variable_type._4_4_ == 0) {
        if (vdr_next._4_4_ != 3) {
          coda_set_error(-300,"CDF file has invalid record type (%d) for rVDR record",
                         (ulong)vdr_next._4_4_);
          return -1;
        }
      }
      else if (vdr_next._4_4_ != 8) {
        coda_set_error(-300,"CDF file has invalid record type (%d) for zVDR record",
                       (ulong)vdr_next._4_4_);
        return -1;
      }
      iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0xc,8,&max_rec);
      if (iVar1 < 0) {
        product_file_local._4_4_ = -1;
      }
      else {
        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x14,4,
                           (void *)((long)&vxr_head + 4));
        if (iVar1 < 0) {
          product_file_local._4_4_ = -1;
        }
        else {
          iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x18,4,&vxr_head);
          if (iVar1 < 0) {
            product_file_local._4_4_ = -1;
          }
          else {
            iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x1c,8,&vxr_tail)
            ;
            if (iVar1 < 0) {
              product_file_local._4_4_ = -1;
            }
            else {
              iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x24,8,
                                 &srecords);
              if (iVar1 < 0) {
                product_file_local._4_4_ = -1;
              }
              else {
                iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x2c,4,
                                   &num_elems);
                if (iVar1 < 0) {
                  product_file_local._4_4_ = -1;
                }
                else {
                  iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x30,4,&num
                                    );
                  if (iVar1 < 0) {
                    product_file_local._4_4_ = -1;
                  }
                  else {
                    iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x40,4,
                                       (void *)((long)&cpr_spr_offset + 4));
                    if (iVar1 < 0) {
                      product_file_local._4_4_ = -1;
                    }
                    else {
                      iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x44,4,
                                         &cpr_spr_offset);
                      if (iVar1 < 0) {
                        product_file_local._4_4_ = -1;
                      }
                      else {
                        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_30 + 0x48,
                                           8,&stack0xffffffffffffff78);
                        if (iVar1 < 0) {
                          product_file_local._4_4_ = -1;
                        }
                        else {
                          iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                             iStack_30 + 0x50,4,local_8c);
                          if (iVar1 < 0) {
                            product_file_local._4_4_ = -1;
                          }
                          else {
                            iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                               iStack_30 + 0x54,0x100,local_198);
                            if (iVar1 < 0) {
                              product_file_local._4_4_ = -1;
                            }
                            else {
                              name[0xf8] = '\0';
                              rtrim(local_198);
                              swap8(&max_rec);
                              swap4((void *)((long)&vxr_head + 4));
                              swap4(&vxr_head);
                              swap8(&vxr_tail);
                              swap8(&srecords);
                              swap4(&num_elems);
                              swap4(&num);
                              swap4((void *)((long)&cpr_spr_offset + 4));
                              swap4(&cpr_spr_offset);
                              swap8(&stack0xffffffffffffff78);
                              swap4(local_8c);
                              if ((_max_rec < 0) || (*(long *)(offset_local + 8) <= _max_rec)) {
                                coda_set_error(-300,"CDF file has invalid offset for VDR record");
                                product_file_local._4_4_ = -1;
                              }
                              else if ((vxr_tail < 0) || (*(long *)(offset_local + 8) <= vxr_tail))
                              {
                                coda_set_error(-300,"CDF file has invalid offset for VXR record");
                                product_file_local._4_4_ = -1;
                              }
                              else if ((_srecords < 0) || (*(long *)(offset_local + 8) <= _srecords)
                                      ) {
                                coda_set_error(-300,"CDF file has invalid offset for VXR record");
                                product_file_local._4_4_ = -1;
                              }
                              else if (cpr_spr_offset._4_4_ < 0) {
                                coda_set_error(-300,
                                               "CDF file has invalid number of elements in VDR record"
                                              );
                                product_file_local._4_4_ = -1;
                              }
                              else if ((int)(uint)cpr_spr_offset < 0) {
                                coda_set_error(-300,
                                               "CDF file has invalid variable number in VDR record")
                                ;
                                product_file_local._4_4_ = -1;
                              }
                              else if ((lStack_88 < -1) ||
                                      (*(long *)(offset_local + 8) <= lStack_88)) {
                                coda_set_error(-300,"CDF file has invalid offset for CPR/SPR record"
                                              );
                                product_file_local._4_4_ = -1;
                              }
                              else if (vxr_head._4_4_ == 0x20) {
                                coda_set_error(-200,"CDF EPOCH16 data type is not supported");
                                product_file_local._4_4_ = -1;
                              }
                              else {
                                if (variable_type._4_4_ == 0) {
                                  local_19c = *(uint *)(offset_local + 0x68);
                                }
                                else {
                                  iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                                     iStack_30 + 0x154,4,&local_19c);
                                  if (iVar1 < 0) {
                                    return -1;
                                  }
                                  swap4(&local_19c);
                                  if ((int)local_19c < 0) {
                                    coda_set_error(-300,
                                                  "CDF variable \'%s\' has invalid number of dimensions (%d)"
                                                  ,local_198,(ulong)local_19c);
                                    return -1;
                                  }
                                  if (8 < (int)local_19c) {
                                    coda_set_error(-300,
                                                  "CDF variable \'%s\' has too many dimensions (%d)"
                                                  ,local_198,(ulong)local_19c);
                                    return -1;
                                  }
                                  iStack_30 = iStack_30 + 0x158;
                                  if (0 < (int)local_19c) {
                                    for (local_1f4 = 0; local_1f4 < (int)local_19c;
                                        local_1f4 = local_1f4 + 1) {
                                      iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                                         iStack_30 + (local_1f4 << 2),4,
                                                         dim_varys + (long)local_1f4 + 6);
                                      if (iVar1 < 0) {
                                        return -1;
                                      }
                                      swap4(dim_varys + (long)local_1f4 + 6);
                                    }
                                    iStack_30 = (int)(local_19c << 2) + iStack_30;
                                  }
                                }
                                if (0 < (int)local_19c) {
                                  for (local_1f4 = 0; local_1f4 < (int)local_19c;
                                      local_1f4 = local_1f4 + 1) {
                                    iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                                       iStack_30 + (local_1f4 << 2),4,
                                                       &has_compression + local_1f4);
                                    if (iVar1 < 0) {
                                      return -1;
                                    }
                                    swap4(&has_compression + local_1f4);
                                  }
                                  iStack_30 = (int)(local_19c << 2) + iStack_30;
                                }
                                rec_varys = num_elems & 1;
                                has_compression_00 = num_elems & 4;
                                if ((rec_varys == 0) && ((int)vxr_head != 0)) {
                                  coda_set_error(-300,
                                                 "CDF variable \'%s\' has non-varying record dimension but number of records (%d) is not equal to 1"
                                                 ,local_198,(ulong)((int)vxr_head + 1));
                                  product_file_local._4_4_ = -1;
                                }
                                else if ((has_compression_00 == 0) ||
                                        ((lStack_88 == -1 ||
                                         (iVar1 = read_CPR((coda_cdf_product *)offset_local,
                                                           lStack_88), iVar1 == 0)))) {
                                  if (*(long *)(*(long *)(offset_local + 0x18) + 0x20) ==
                                      (long)(int)(uint)cpr_spr_offset) {
                                    if (variable_type._4_4_ == 0) {
                                      variable = (coda_cdf_variable *)
                                                 coda_cdf_variable_new
                                                           (vxr_head._4_4_,(int)vxr_head,rec_varys,
                                                            local_19c,
                                                            (int32_t *)(offset_local + 0x6c),
                                                            &has_compression,
                                                            *(coda_array_ordering *)
                                                             (offset_local + 0x60),
                                                            cpr_spr_offset._4_4_,num,
                                                            has_compression_00,
                                                            &stack0xffffffffffffffb8);
                                    }
                                    else {
                                      variable = (coda_cdf_variable *)
                                                 coda_cdf_variable_new
                                                           (vxr_head._4_4_,(int)vxr_head,rec_varys,
                                                            local_19c,dim_varys + 6,&has_compression
                                                            ,*(coda_array_ordering *)
                                                              (offset_local + 0x60),
                                                            cpr_spr_offset._4_4_,num,
                                                            has_compression_00,
                                                            &stack0xffffffffffffffb8);
                                    }
                                    if (variable == (coda_cdf_variable *)0x0) {
                                      product_file_local._4_4_ = -1;
                                    }
                                    else {
                                      iVar1 = coda_mem_record_add_field
                                                        (*(coda_mem_record **)(offset_local + 0x18),
                                                         local_198,(coda_dynamic_type *)variable,1);
                                      if (iVar1 == 0) {
                                        iVar1 = read_VXR((coda_cdf_product *)offset_local,pcStack_48
                                                         ,vxr_tail,0,-1);
                                        if (iVar1 == 0) {
                                          iVar1 = read_VDR((coda_cdf_product *)offset_local,_max_rec
                                                           ,variable_type._4_4_);
                                          if (iVar1 == 0) {
                                            product_file_local._4_4_ = 0;
                                          }
                                          else {
                                            product_file_local._4_4_ = -1;
                                          }
                                        }
                                        else {
                                          product_file_local._4_4_ = -1;
                                        }
                                      }
                                      else {
                                        coda_cdf_type_delete((coda_dynamic_type *)variable);
                                        product_file_local._4_4_ = -1;
                                      }
                                    }
                                  }
                                  else {
                                    coda_set_error(-300,
                                                  "CDF variable has invalid number \'%d\', expected \'%ld\'"
                                                  ,(ulong)(uint)cpr_spr_offset,
                                                  *(undefined8 *)
                                                   (*(long *)(offset_local + 0x18) + 0x20));
                                    product_file_local._4_4_ = -1;
                                  }
                                }
                                else {
                                  product_file_local._4_4_ = -1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_VDR(coda_cdf_product *product_file, int64_t offset, int is_zvar)
{
    coda_dynamic_type *variable_type;
    coda_cdf_variable *variable;
    int32_t record_type;
    int64_t vdr_next;
    int32_t data_type;
    int32_t max_rec;
    int64_t vxr_head;
    int64_t vxr_tail;
    int32_t flags;
    int32_t srecords;
    int32_t num_elems;
    int32_t num;
    int64_t cpr_spr_offset;
    int32_t blocking_factor;
    char name[257];
    int32_t num_dims;
    int32_t zdim_sizes[CODA_MAX_NUM_DIMS];
    int32_t dim_varys[CODA_MAX_NUM_DIMS];
    int record_varys;
    int has_compression;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (is_zvar)
    {
        if (record_type != 8)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for zVDR record", record_type);
            return -1;
        }
    }
    else
    {
        if (record_type != 3)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for rVDR record", record_type);
            return -1;
        }
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vdr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &max_rec) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 8, &vxr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 8, &vxr_tail) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 44, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 4, &srecords) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 64, 4, &num_elems) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 72, 8, &cpr_spr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 80, 4, &blocking_factor) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 84, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&vdr_next);
    swap_int32(&data_type);
    swap_int32(&max_rec);
    swap_int64(&vxr_head);
    swap_int64(&vxr_tail);
    swap_int32(&flags);
    swap_int32(&srecords);
    swap_int32(&num_elems);
    swap_int32(&num);
    swap_int64(&cpr_spr_offset);
    swap_int32(&blocking_factor);
#endif
    if (vdr_next < 0 || vdr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VDR record");
        return -1;
    }
    if (vxr_head < 0 || vxr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (vxr_tail < 0 || vxr_tail >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of elements in VDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid variable number in VDR record");
        return -1;
    }
    if (cpr_spr_offset < -1 || cpr_spr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for CPR/SPR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }
    if (is_zvar)
    {
        if (read_bytes(product_file->raw_product, offset + 340, 4, &num_dims) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&num_dims);
#endif
        if (num_dims < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has invalid number of dimensions (%d)", name,
                           num_dims);
            return -1;
        }
        if (num_dims > CODA_MAX_NUM_DIMS)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has too many dimensions (%d)", name, num_dims);
            return -1;
        }
        offset += 344;
        if (num_dims > 0)
        {
            for (i = 0; i < num_dims; i++)
            {
                if (read_bytes(product_file->raw_product, offset + i * 4, 4, &zdim_sizes[i]) < 0)
                {
                    return -1;
                }
#ifndef WORDS_BIGENDIAN
                swap_int32(&zdim_sizes[i]);
#endif
            }
            offset += num_dims * 4;
        }
    }
    else
    {
        num_dims = product_file->rnum_dims;
    }

    if (num_dims > 0)
    {
        for (i = 0; i < num_dims; i++)
        {
            if (read_bytes(product_file->raw_product, offset + i * 4, 4, &dim_varys[i]) < 0)
            {
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&dim_varys[i]);
#endif
        }
        offset += num_dims * 4;
    }
    record_varys = flags & 1;
    /* int has_pad_value = flags & 2; */
    has_compression = flags & 4;
    /* int64_t pad_value_offset = offset; */
    if (!record_varys && max_rec != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has non-varying record dimension but number of records "
                       "(%d) is not equal to 1", name, max_rec + 1);
        return -1;
    }

    if (has_compression && cpr_spr_offset != -1)
    {
        if (read_CPR(product_file, cpr_spr_offset) != 0)
        {
            return -1;
        }
    }
    if (product_file->root_type->num_fields != num)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable has invalid number '%d', expected '%ld'", num,
                       product_file->root_type->num_fields);
        return -1;
    }

    if (is_zvar)
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, zdim_sizes, dim_varys,
                                              product_file->array_ordering, num_elems, srecords, has_compression,
                                              &variable);
    }
    else
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, product_file->rdim_sizes,
                                              dim_varys, product_file->array_ordering, num_elems, srecords,
                                              has_compression, &variable);
    }
    if (variable_type == NULL)
    {
        return -1;
    }
    if (coda_mem_record_add_field(product_file->root_type, name, variable_type, 1) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)variable_type);
        return -1;
    }

    if (read_VXR(product_file, variable, vxr_head, 0, -1) != 0)
    {
        return -1;
    }

    if (read_VDR(product_file, vdr_next, is_zvar) != 0)
    {
        return -1;
    }

    return 0;
}